

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O2

void __thiscall
PSVIWriterHandlers::processElementDeclaration
          (PSVIWriterHandlers *this,XSElementDeclaration *element)

{
  char cVar1;
  VALUE_CONSTRAINT valueConstraintType;
  XMLCh *pXVar2;
  XMLCh *value;
  
  if (element != (XSElementDeclaration *)0x0) {
    sendIndentedElementWithID
              (this,(XMLCh *)&xercesc_4_0::PSVIUni::fgElementDeclaration,(XSObject *)element);
    pXVar2 = (XMLCh *)(**(code **)(*(long *)element + 0x10))(element);
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgName,pXVar2);
    pXVar2 = (XMLCh *)(**(code **)(*(long *)element + 0x18))(element);
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgTargetNamespace,pXVar2);
    processTypeDefinitionOrRef
              (this,(XMLCh *)&xercesc_4_0::PSVIUni::fgTypeDefinition,
               *(XSTypeDefinition **)(element + 0x38));
    processScope(this,*(XSComplexTypeDefinition **)(element + 0x40),*(short *)(element + 0x2c));
    valueConstraintType = xercesc_4_0::XSElementDeclaration::getConstraintType();
    pXVar2 = (XMLCh *)xercesc_4_0::XSElementDeclaration::getConstraintValue();
    processValueConstraint(this,valueConstraintType,pXVar2);
    cVar1 = xercesc_4_0::XSElementDeclaration::getNillable();
    value = (XMLCh *)&xercesc_4_0::PSVIUni::fgFalse;
    pXVar2 = (XMLCh *)&xercesc_4_0::PSVIUni::fgFalse;
    if (cVar1 != '\0') {
      pXVar2 = (XMLCh *)&xercesc_4_0::PSVIUni::fgTrue;
    }
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNillable,pXVar2);
    processIdentityConstraintDefinition
              (this,*(XSNamedMap<xercesc_4_0::XSIDCDefinition> **)(element + 0x58));
    processElementDeclarationRef
              (this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSubstitutionGroupAffiliation,
               *(XSElementDeclaration **)(element + 0x48));
    pXVar2 = translateBlockOrFinal(this,*(short *)(element + 0x2a));
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSubstitutionGroupExclusions,pXVar2);
    pXVar2 = translateBlockOrFinal(this,*(short *)(element + 0x28));
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgDisallowedSubstitutions,pXVar2);
    cVar1 = xercesc_4_0::XSElementDeclaration::getAbstract();
    if (cVar1 != '\0') {
      value = (XMLCh *)&xercesc_4_0::PSVIUni::fgTrue;
    }
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAbstract,value);
    processAnnotation(this,*(XSAnnotation **)(element + 0x50));
    sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgElementDeclaration);
    return;
  }
  sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgElementDeclaration);
  return;
}

Assistant:

void PSVIWriterHandlers::processElementDeclaration(XSElementDeclaration* element) {
	if (element == NULL) {
		sendElementEmpty(PSVIUni::fgElementDeclaration);
	} else {
		sendIndentedElementWithID(PSVIUni::fgElementDeclaration, (XSObject*) element);
		sendElementValue(PSVIUni::fgName, element->getName());
		sendElementValue(PSVIUni::fgTargetNamespace, element->getNamespace());
		processTypeDefinitionOrRef(PSVIUni::fgTypeDefinition, element->getTypeDefinition());
		processScope(element->getEnclosingCTDefinition(), element->getScope());
		processValueConstraint(element->getConstraintType(), element->getConstraintValue());
		sendElementValue(PSVIUni::fgNillable, translateBool(element->getNillable()));
		processIdentityConstraintDefinition(element->getIdentityConstraints());
		processElementDeclarationRef(PSVIUni::fgSubstitutionGroupAffiliation,
			element->getSubstitutionGroupAffiliation());
		sendElementValue(PSVIUni::fgSubstitutionGroupExclusions,
			translateBlockOrFinal(element->getSubstitutionGroupExclusions()));
		sendElementValue(PSVIUni::fgDisallowedSubstitutions,
			translateBlockOrFinal(element->getDisallowedSubstitutions()));
		sendElementValue(PSVIUni::fgAbstract, translateBool(element->getAbstract()));
		processAnnotation(element->getAnnotation());
		sendUnindentedElement(PSVIUni::fgElementDeclaration);
	}
}